

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeHeap.cpp
# Opt level: O1

void __thiscall wasm::SafeHeap::addLoadFunc(SafeHeap *this,Load style,Module *module)

{
  _Head_base<0UL,_wasm::Function_*,_false> _Var1;
  Type indexType;
  Name name;
  Function *pFVar2;
  Memory *pMVar3;
  Block *this_00;
  Expression *pEVar4;
  Expression *pEVar5;
  Binary *this_01;
  LocalSet *item;
  undefined4 *puVar6;
  BinaryOp BVar7;
  ExpressionList *this_02;
  initializer_list<wasm::Type> types;
  Signature sig;
  initializer_list<wasm::Type> __l;
  Name NVar8;
  Name name_00;
  Type local_98;
  Type local_90;
  HeapType local_88;
  MixedArena *local_80;
  SafeHeap *local_78;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_70;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> func;
  _Head_base<0UL,_wasm::Function_*,_false> local_50;
  Builder builder;
  pointer local_40;
  allocator_type local_31;
  
  NVar8 = getLoadName(&style);
  pFVar2 = Module::getFunctionOrNull(module,NVar8);
  if (pFVar2 == (Function *)0x0) {
    name.super_IString.str._M_str = style.memory.super_IString.str._M_str;
    name.super_IString.str._M_len = style.memory.super_IString.str._M_len;
    local_78 = this;
    pMVar3 = Module::getMemory(module,name);
    _Var1._M_head_impl = (Function *)(pMVar3->indexType).id;
    types._M_len = 2;
    types._M_array = (iterator)&stack0xffffffffffffffb0;
    local_50._M_head_impl = _Var1._M_head_impl;
    builder.wasm = (Module *)_Var1._M_head_impl;
    wasm::Type::Type(&local_90,types);
    sig.results.id =
         style.super_SpecificExpression<(wasm::Expression::Id)12>.super_Expression.type.id;
    sig.params.id = local_90.id;
    HeapType::HeapType(&local_88,sig);
    __l._M_len = 1;
    __l._M_array = &local_98;
    local_98.id = (uintptr_t)_Var1._M_head_impl;
    func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
         (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
         _Var1._M_head_impl;
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&stack0xffffffffffffffb0,__l,
               &local_31);
    name_00.super_IString.str._M_str = NVar8.super_IString.str._M_len;
    name_00.super_IString.str._M_len = (size_t)&local_70;
    Builder::makeFunction
              (name_00,(HeapType)NVar8.super_IString.str._M_str,
               (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_88.id,
               (Expression *)&stack0xffffffffffffffb0);
    if (local_50._M_head_impl != (Function *)0x0) {
      operator_delete(local_50._M_head_impl,(long)local_40 - (long)local_50._M_head_impl);
    }
    local_80 = &module->allocator;
    local_50._M_head_impl = (Function *)module;
    this_00 = (Block *)MixedArena::allocSpace(local_80,0x40,8);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = BlockId;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
    (this_00->name).super_IString.str._M_len = 0;
    (this_00->name).super_IString.str._M_str = (char *)0x0;
    (this_00->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
         = (Expression **)0x0;
    (this_00->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
    usedElements = 0;
    (this_00->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
    allocatedElements = 0;
    (this_00->list).allocator = local_80;
    BVar7 = AddInt64;
    if ((pMVar3->indexType).id != 3) {
      BVar7 = AddInt32;
    }
    pEVar4 = (Expression *)
             MixedArena::allocSpace((MixedArena *)((long)local_50._M_head_impl + 0x158),0x18,8);
    pEVar4->_id = LocalGetId;
    pEVar4[1]._id = InvalidId;
    (pEVar4->type).id =
         (uintptr_t)
         func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
         super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    pEVar5 = (Expression *)
             MixedArena::allocSpace((MixedArena *)((long)local_50._M_head_impl + 0x158),0x18,8);
    pEVar5->_id = LocalGetId;
    pEVar5[1]._id = BlockId;
    (pEVar5->type).id =
         (uintptr_t)
         func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
         super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    this_01 = (Binary *)
              MixedArena::allocSpace((MixedArena *)((long)local_50._M_head_impl + 0x158),0x28,8);
    (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    this_01->op = BVar7;
    this_01->left = pEVar4;
    this_01->right = pEVar5;
    Binary::finalize(this_01);
    item = Builder::makeLocalSet((Builder *)&stack0xffffffffffffffb0,2,(Expression *)this_01);
    this_02 = &this_00->list;
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&this_02->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)item);
    indexType.id = (pMVar3->indexType).id;
    pEVar4 = makeBoundsCheck(local_78,style.super_SpecificExpression<(wasm::Expression::Id)12>.
                                      super_Expression.type,(Builder *)&stack0xffffffffffffffb0,2,
                             (uint)style.bytes,module,indexType,indexType.id == 3,
                             (Name)(pMVar3->super_Importable).super_Named.name.super_IString.str);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&this_02->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               pEVar4);
    if (1 < style.align.addr) {
      NVar8.super_IString.str._M_str._4_4_ =
           (int)((ulong)(pMVar3->super_Importable).super_Named.name.super_IString.str._M_str >> 0x20
                );
      NVar8.super_IString.str._0_12_ =
           *(undefined1 (*) [12])&(pMVar3->super_Importable).super_Named.name.super_IString.str;
      pEVar4 = makeAlignCheck(local_78,style.align,(Builder *)&stack0xffffffffffffffb0,2,module,
                              NVar8);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&this_02->
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,pEVar4)
      ;
    }
    pEVar5 = (Expression *)MixedArena::allocSpace(local_80,0x48,8);
    pEVar5->_id = LoadId;
    (pEVar5->type).id = 0;
    *(byte *)((long)&pEVar5[1]._id + 1) = 0;
    pEVar5[3].type.id = 0;
    *(undefined8 *)(pEVar5 + 4) = 0;
    pEVar5[1].type.id = 0;
    *(undefined8 *)(pEVar5 + 2) = 0;
    pEVar5->_id = style.super_SpecificExpression<(wasm::Expression::Id)12>.super_Expression._id;
    *(undefined4 *)&pEVar5->field_0x4 =
         style.super_SpecificExpression<(wasm::Expression::Id)12>.super_Expression._4_4_;
    (pEVar5->type).id =
         style.super_SpecificExpression<(wasm::Expression::Id)12>.super_Expression.type.id;
    *(ushort *)&pEVar5[1]._id = CONCAT11(style.signed_,style.bytes);
    pEVar5[1].type.id = style.offset.addr;
    *(address64_t *)(pEVar5 + 2) = style.align.addr;
    pEVar5[2].type.id = style._40_8_;
    *(Expression **)(pEVar5 + 3) = style.ptr;
    pEVar5[3].type.id = style.memory.super_IString.str._M_len;
    *(char **)(pEVar5 + 4) = style.memory.super_IString.str._M_str;
    puVar6 = (undefined4 *)
             MixedArena::allocSpace((MixedArena *)((long)local_50._M_head_impl + 0x158),0x18,8);
    *puVar6 = 8;
    puVar6[4] = 2;
    ((__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true> *)
    (puVar6 + 2))->super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_> =
         (__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>)
         func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
         super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    *(undefined4 **)(pEVar5 + 3) = puVar6;
    pEVar4 = pEVar5;
    if (((char)pEVar5[2].type.id == '\x01') && (*(byte *)((long)&pEVar5[1]._id + 1) == 1)) {
      pEVar4 = Bits::makeSignExt(pEVar5,(uint)(byte)(char)pEVar5[1]._id,module);
      *(byte *)((long)&pEVar5[1]._id + 1) = 0;
    }
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&this_02->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               pEVar4);
    Block::finalize(this_00,style.super_SpecificExpression<(wasm::Expression::Id)12>.
                            super_Expression.type);
    *(Block **)
     ((long)local_70._M_t.
            super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
            super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x60) = this_00;
    Module::addFunction(module,&local_70);
    std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_70);
  }
  return;
}

Assistant:

void addLoadFunc(Load style, Module* module) {
    auto name = getLoadName(&style);
    if (module->getFunctionOrNull(name)) {
      return;
    }
    // pointer, offset
    auto memory = module->getMemory(style.memory);
    auto indexType = memory->indexType;
    auto funcSig = Signature({indexType, indexType}, style.type);
    auto func = Builder::makeFunction(name, funcSig, {indexType});
    Builder builder(*module);
    auto* block = builder.makeBlock();
    block->list.push_back(builder.makeLocalSet(
      2,
      builder.makeBinary(memory->is64() ? AddInt64 : AddInt32,
                         builder.makeLocalGet(0, indexType),
                         builder.makeLocalGet(1, indexType))));
    // check for reading past valid memory: if pointer + offset + bytes
    block->list.push_back(makeBoundsCheck(style.type,
                                          builder,
                                          2,
                                          style.bytes,
                                          module,
                                          memory->indexType,
                                          memory->is64(),
                                          memory->name));
    // check proper alignment
    if (style.align > 1) {
      block->list.push_back(
        makeAlignCheck(style.align, builder, 2, module, memory->name));
    }
    // do the load
    auto* load = module->allocator.alloc<Load>();
    *load = style; // basically the same as the template we are given!
    load->ptr = builder.makeLocalGet(2, indexType);
    Expression* last = load;
    if (load->isAtomic && load->signed_) {
      // atomic loads cannot be signed, manually sign it
      last = Bits::makeSignExt(load, load->bytes, *module);
      load->signed_ = false;
    }
    block->list.push_back(last);
    block->finalize(style.type);
    func->body = block;
    module->addFunction(std::move(func));
  }